

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O2

uint32_t secp256k1_scalar_get_bits_limb32(secp256k1_scalar *a,uint offset,uint count)

{
  uint uVar1;
  
  secp256k1_scalar_verify(a);
  if (0xffffffdf < count - 0x21) {
    uVar1 = 0;
    if (offset < 0x20) {
      uVar1 = ((*a >> ((byte)offset & 0x1f)) << (-(char)count & 0x1fU)) >> (-(char)count & 0x1fU);
    }
    return uVar1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/scalar_low_impl.h"
          ,0x1f,"test condition failed: count > 0 && count <= 32");
  abort();
}

Assistant:

SECP256K1_INLINE static uint32_t secp256k1_scalar_get_bits_limb32(const secp256k1_scalar *a, unsigned int offset, unsigned int count) {
    SECP256K1_SCALAR_VERIFY(a);

    VERIFY_CHECK(count > 0 && count <= 32);
    if (offset < 32) {
        return (*a >> offset) & (0xFFFFFFFF >> (32 - count));
    } else {
        return 0;
    }
}